

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcParser::add_nested_stm(CTcParser *this,CTPNStmTop *stm)

{
  CTPNStmTop **ppCVar1;
  
  ppCVar1 = &this->nested_stm_tail_->next_stm_top_;
  if (this->nested_stm_tail_ == (CTPNStmTop *)0x0) {
    ppCVar1 = &this->nested_stm_head_;
  }
  *ppCVar1 = stm;
  this->nested_stm_tail_ = stm;
  return;
}

Assistant:

void CTcParser::add_nested_stm(CTPNStmTop *stm)
{
    /* link it into our list */
    if (nested_stm_tail_ != 0)
        nested_stm_tail_->set_next_stm_top(stm);
    else
        nested_stm_head_ = stm;
    nested_stm_tail_ = stm;
}